

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_math_stroke.h
# Opt level: O0

void __thiscall
agg::math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::calc_cap
          (math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_> *this,
          pod_bvector<agg::point_base<double>,_6U> *vc,vertex_dist *v0,vertex_dist *v1,double len)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  double __x;
  double __y;
  double dVar5;
  double dVar6;
  double dVar7;
  int local_64;
  int n;
  int i;
  double a1;
  double da;
  double dy2;
  double dx2;
  double dy1;
  double dx1;
  double len_local;
  vertex_dist *v1_local;
  vertex_dist *v0_local;
  pod_bvector<agg::point_base<double>,_6U> *vc_local;
  math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_> *this_local;
  
  pod_bvector<agg::point_base<double>,_6U>::remove_all(vc);
  dy2 = 0.0;
  da = 0.0;
  __x = this->m_width * ((v1->y - v0->y) / len);
  __y = this->m_width * ((v1->x - v0->x) / len);
  if (this->m_line_cap == round_cap) {
    dVar5 = acos(this->m_width_abs / (this->m_width_abs + 0.125 / this->m_approx_scale));
    iVar4 = (int)(3.141592653589793 / (dVar5 * 2.0));
    dVar5 = 3.141592653589793 / (double)(iVar4 + 1);
    add_vertex(this,vc,v0->x - __x,v0->y + __y);
    if (this->m_width_sign < 1) {
      _n = atan2(-__y,__x);
      for (local_64 = 0; _n = _n - dVar5, local_64 < iVar4; local_64 = local_64 + 1) {
        dVar1 = v0->x;
        dVar6 = cos(_n);
        dVar2 = this->m_width;
        dVar3 = v0->y;
        dVar7 = sin(_n);
        add_vertex(this,vc,dVar6 * dVar2 + dVar1,dVar7 * this->m_width + dVar3);
      }
    }
    else {
      _n = atan2(__y,-__x);
      for (local_64 = 0; _n = dVar5 + _n, local_64 < iVar4; local_64 = local_64 + 1) {
        dVar1 = v0->x;
        dVar6 = cos(_n);
        dVar2 = this->m_width;
        dVar3 = v0->y;
        dVar7 = sin(_n);
        add_vertex(this,vc,dVar6 * dVar2 + dVar1,dVar7 * this->m_width + dVar3);
      }
    }
    add_vertex(this,vc,v0->x + __x,v0->y - __y);
  }
  else {
    if (this->m_line_cap == square_cap) {
      dy2 = __y * (double)this->m_width_sign;
      da = __x * (double)this->m_width_sign;
    }
    add_vertex(this,vc,(v0->x - __x) - dy2,(v0->y + __y) - da);
    add_vertex(this,vc,(v0->x + __x) - dy2,(v0->y - __y) - da);
  }
  return;
}

Assistant:

void math_stroke<VC>::calc_cap(VC& vc,
                                   const vertex_dist& v0, 
                                   const vertex_dist& v1, 
                                   double len)
    {
        vc.remove_all();

        double dx1 = (v1.y - v0.y) / len;
        double dy1 = (v1.x - v0.x) / len;
        double dx2 = 0;
        double dy2 = 0;

        dx1 *= m_width;
        dy1 *= m_width;

        if(m_line_cap != round_cap)
        {
            if(m_line_cap == square_cap)
            {
                dx2 = dy1 * m_width_sign;
                dy2 = dx1 * m_width_sign;
            }
            add_vertex(vc, v0.x - dx1 - dx2, v0.y + dy1 - dy2);
            add_vertex(vc, v0.x + dx1 - dx2, v0.y - dy1 - dy2);
        }
        else
        {
            double da = acos(m_width_abs / (m_width_abs + 0.125 / m_approx_scale)) * 2;
            double a1;
            int i;
            int n = int(pi / da);

            da = pi / (n + 1);
            add_vertex(vc, v0.x - dx1, v0.y + dy1);
            if(m_width_sign > 0)
            {
                a1 = atan2(dy1, -dx1);
                a1 += da;
                for(i = 0; i < n; i++)
                {
                    add_vertex(vc, v0.x + cos(a1) * m_width, 
                                   v0.y + sin(a1) * m_width);
                    a1 += da;
                }
            }
            else
            {
                a1 = atan2(-dy1, dx1);
                a1 -= da;
                for(i = 0; i < n; i++)
                {
                    add_vertex(vc, v0.x + cos(a1) * m_width, 
                                   v0.y + sin(a1) * m_width);
                    a1 -= da;
                }
            }
            add_vertex(vc, v0.x + dx1, v0.y - dy1);
        }
    }